

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_swab.c
# Opt level: O2

void TIFFReverseBits(uint8_t *cp,tmsize_t n)

{
  for (; 8 < n; n = n + -8) {
    *cp = ""[*cp];
    cp[1] = ""[cp[1]];
    cp[2] = ""[cp[2]];
    cp[3] = ""[cp[3]];
    cp[4] = ""[cp[4]];
    cp[5] = ""[cp[5]];
    cp[6] = ""[cp[6]];
    cp[7] = ""[cp[7]];
    cp = cp + 8;
  }
  for (; 0 < n; n = n + -1) {
    *cp = ""[*cp];
    cp = cp + 1;
  }
  return;
}

Assistant:

void TIFFReverseBits(uint8_t *cp, tmsize_t n)
{
    for (; n > 8; n -= 8)
    {
        cp[0] = TIFFBitRevTable[cp[0]];
        cp[1] = TIFFBitRevTable[cp[1]];
        cp[2] = TIFFBitRevTable[cp[2]];
        cp[3] = TIFFBitRevTable[cp[3]];
        cp[4] = TIFFBitRevTable[cp[4]];
        cp[5] = TIFFBitRevTable[cp[5]];
        cp[6] = TIFFBitRevTable[cp[6]];
        cp[7] = TIFFBitRevTable[cp[7]];
        cp += 8;
    }
    while (n-- > 0)
    {
        *cp = TIFFBitRevTable[*cp];
        cp++;
    }
}